

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_null_implementation.cpp
# Opt level: O1

DataBlob __thiscall
hrgls::datablob::DataBlobSource::GetNextBlob(DataBlobSource *this,timeval timeout)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  mapped_type *pmVar7;
  undefined8 uVar8;
  long in_RCX;
  long *plVar9;
  key_type local_38;
  
  plVar9 = (long *)timeout.tv_sec;
  DataBlob::DataBlob((DataBlob *)this);
  if (*plVar9 != 0) {
    lVar5 = std::chrono::_V2::system_clock::now();
    do {
      lVar1 = *plVar9;
      iVar4 = pthread_mutex_lock((pthread_mutex_t *)(lVar1 + 0xd8));
      if (iVar4 != 0) {
        iVar4 = std::__throw_system_error(iVar4);
LAB_00107e9b:
        uVar8 = std::__throw_system_error(iVar4);
        DataBlob::~DataBlob((DataBlob *)this);
        _Unwind_Resume(uVar8);
      }
      lVar2 = *plVar9;
      lVar3 = *(long *)(lVar2 + 0x100);
      lVar6 = std::chrono::_V2::system_clock::now();
      pthread_mutex_unlock((pthread_mutex_t *)(lVar1 + 0xd8));
      if (lVar3 != lVar2 + 0x100) {
        lVar5 = *plVar9;
        iVar4 = pthread_mutex_lock((pthread_mutex_t *)(lVar5 + 0xd8));
        if (iVar4 == 0) {
          DataBlob::operator=((DataBlob *)this,(DataBlob *)(*(long *)(*plVar9 + 0x100) + 0x10));
          std::__cxx11::list<hrgls::datablob::DataBlob,_std::allocator<hrgls::datablob::DataBlob>_>
          ::_M_erase((list<hrgls::datablob::DataBlob,_std::allocator<hrgls::datablob::DataBlob>_> *)
                     (*plVar9 + 0x100),*(_List_node_base **)(*plVar9 + 0x100));
          lVar1 = *plVar9;
          local_38._M_thread = pthread_self();
          pmVar7 = std::
                   map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
                   ::operator[]((map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
                                 *)(lVar1 + 0x38),&local_38);
          *pmVar7 = 0;
          pthread_mutex_unlock((pthread_mutex_t *)(lVar5 + 0xd8));
          return (DataBlob)(DataBlob_private *)this;
        }
        goto LAB_00107e9b;
      }
    } while ((double)((float)(lVar6 - lVar5) / 1e+09) <
             (double)in_RCX / 1000000.0 + (double)timeout.tv_usec);
    lVar5 = *plVar9;
    local_38._M_thread = pthread_self();
    pmVar7 = std::
             map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
             ::operator[]((map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
                           *)(lVar5 + 0x38),&local_38);
    *pmVar7 = 1;
  }
  return (DataBlob)(DataBlob_private *)this;
}

Assistant:

DataBlob DataBlobSource::GetNextBlob(struct timeval timeout)
    {
      DataBlob ret;
      if (!m_private) {
        return ret;
      }

      // Keep checking for a new blob until we either find one or time out.
      bool empty;
      double timeoutSeconds = timeout.tv_sec + timeout.tv_usec / 1e6;
      std::chrono::duration<float> dt;
      auto start = std::chrono::system_clock::now();
      do {
        std::lock_guard<std::mutex> lock(m_private->storedBlobsMutex);
        empty = m_private->storedBlobs.empty();
        auto now = std::chrono::system_clock::now();
        dt = now - start;
      } while (empty && (dt.count() < timeoutSeconds));

      if (!empty) {
        std::lock_guard<std::mutex> lock(m_private->storedBlobsMutex);
        ret = m_private->storedBlobs.front();
        m_private->storedBlobs.pop_front();
        m_private->status[std::this_thread::get_id()] = hrgls_STATUS_OKAY;
      } else {
        m_private->status[std::this_thread::get_id()] = hrgls_STATUS_TIMEOUT;
      }

      return ret;
    }